

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O1

void __thiscall
CivetServer::CivetServer
          (CivetServer *this,char **options,CivetCallbacks *_callbacks,void *UserContextIn)

{
  _Rb_tree_header *p_Var1;
  mg_context *pmVar2;
  runtime_error *this_00;
  _func_void_mg_connection_ptr *p_Var3;
  string exceptionMsg;
  mg_error_data mg_start_error_data;
  mg_init_data mg_start_init_data;
  CivetCallbacks callbacks;
  char errtxtbuf [256];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  mg_error_data local_208;
  mg_init_data local_1e8;
  mg_callbacks local_1c8;
  char local_138 [264];
  
  this->_vptr_CivetServer = (_func_int **)&PTR__CivetServer_00184748;
  p_Var3 = (_func_void_mg_connection_ptr *)0x0;
  this->context = (mg_context *)0x0;
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  memset(&local_1c8,0,0x90);
  this->UserContext = UserContextIn;
  if (_callbacks != (CivetCallbacks *)0x0) {
    memcpy(&local_1c8,_callbacks,0x90);
    p_Var3 = (_callbacks->super_mg_callbacks).connection_close;
  }
  this->userCloseHandler = p_Var3;
  local_1c8.connection_close = closeHandler;
  local_208.code = 0;
  local_208.code_sub = 0;
  local_208.text = (char *)0x0;
  local_208.text_buffer_size = 0;
  local_1e8.callbacks = &local_1c8;
  local_1e8.user_data = this;
  local_1e8.configuration_options = options;
  memset(local_138,0,0x100);
  local_208.text_buffer_size = 0x100;
  local_208.text = local_138;
  pmVar2 = mg_start2(&local_1e8,&local_208);
  this->context = pmVar2;
  if (pmVar2 != (mg_context *)0x0) {
    return;
  }
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,
             "null context when constructing CivetServer. Possible problem binding to port. Error: "
             ,"");
  std::__cxx11::string::append((char *)local_228);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_228);
  *(undefined ***)this_00 = &PTR__runtime_error_00184880;
  __cxa_throw(this_00,&CivetException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CivetServer::CivetServer(const char **options,
                         const struct CivetCallbacks *_callbacks,
                         const void *UserContextIn)
    : context(0)
{
	struct CivetCallbacks callbacks;

	UserContext = UserContextIn;

	if (_callbacks) {
		callbacks = *_callbacks;
		userCloseHandler = _callbacks->connection_close;
	} else {
		userCloseHandler = NULL;
	}
	callbacks.connection_close = closeHandler;
	struct mg_init_data mg_start_init_data = {0};
	mg_start_init_data.callbacks = &callbacks;
	mg_start_init_data.user_data = this;
	mg_start_init_data.configuration_options = options;

	struct mg_error_data mg_start_error_data = {0};
	char errtxtbuf[256] = {0};
	mg_start_error_data.text = errtxtbuf;
	mg_start_error_data.text_buffer_size = sizeof(errtxtbuf);

	context = mg_start2(&mg_start_init_data, &mg_start_error_data);

	if (context == NULL) {
		std::string exceptionMsg =
		    "null context when constructing CivetServer. "
		    "Possible problem binding to port. Error: ";
		exceptionMsg += errtxtbuf;
		throw CivetException(exceptionMsg);
	}
}